

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplerate.c
# Opt level: O3

int src_set_ratio(SRC_STATE *state,double new_ratio)

{
  int iVar1;
  
  if (state == (SRC_STATE *)0x0) {
    iVar1 = 2;
  }
  else {
    iVar1 = 7;
    if ((((*(long *)(state + 0x28) != 0) && (*(long *)(state + 0x30) != 0)) &&
        (iVar1 = 6, 0.00390625 <= new_ratio)) && (new_ratio <= 256.0)) {
      *(double *)state = new_ratio;
      return 0;
    }
  }
  return iVar1;
}

Assistant:

int
src_set_ratio (SRC_STATE *state, double new_ratio)
{	SRC_PRIVATE *psrc ;

	psrc = (SRC_PRIVATE*) state ;

	if (psrc == NULL)
		return SRC_ERR_BAD_STATE ;
	if (psrc->vari_process == NULL || psrc->const_process == NULL)
		return SRC_ERR_BAD_PROC_PTR ;

	if (is_bad_src_ratio (new_ratio))
		return SRC_ERR_BAD_SRC_RATIO ;

	psrc->last_ratio = new_ratio ;

	return SRC_ERR_NO_ERROR ;
}